

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O0

int upsample(double *x,int lenx,int M,double *y)

{
  int local_38;
  int local_34;
  int k;
  int j;
  int i;
  int N;
  double *y_local;
  int M_local;
  int lenx_local;
  double *x_local;
  
  if (M < 0) {
    x_local._4_4_ = -1;
  }
  else if (M == 0) {
    for (k = 0; x_local._4_4_ = lenx, k < lenx; k = k + 1) {
      y[k] = x[k];
    }
  }
  else {
    x_local._4_4_ = M * (lenx + -1) + 1;
    local_34 = 1;
    local_38 = 0;
    for (k = 0; k < x_local._4_4_; k = k + 1) {
      local_34 = local_34 + -1;
      y[k] = 0.0;
      if (local_34 == 0) {
        y[k] = x[local_38];
        local_38 = local_38 + 1;
        local_34 = M;
      }
    }
  }
  return x_local._4_4_;
}

Assistant:

int upsample(double *x,int lenx, int M, double *y) {
	int N,i,j,k;

	if (M < 0) {
		return -1;
	}

	if (M == 0) {
		for (i = 0; i < lenx; ++i) {
			y[i] = x[i];
		}
		return lenx;
	}

	N = M * (lenx-1) + 1;
	j = 1;
	k = 0;

	for(i = 0; i < N;++i) {
		j--;
		y[i] = 0.0;
		if (j == 0) {
			y[i] = x[k];
			k++;
			j = M;
		}
	}

	return N;
}